

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::
Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
Perform(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
        *this)

{
  bool bVar1;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *pvVar2;
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  pvVar2 = internal::
           Apply<std::function<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const&()>const&,std::tuple<>>
                     (&this->fun_,(tuple<> *)((long)&this_local + 7));
  return pvVar2;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }